

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O3

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  *(undefined ***)
   &(this->super_TPZCompElH1<pzshape::TPZShapePoint>).super_TPZIntelGen<pzshape::TPZShapePoint>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_01929530;
  TPZCompElH1<pzshape::TPZShapePoint>::TPZCompElH1
            (&this->super_TPZCompElH1<pzshape::TPZShapePoint>,&PTR_PTR_019281e8,mesh,
             &copy->super_TPZCompElH1<pzshape::TPZShapePoint>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZCompElH1<pzshape::TPZShapePoint>).super_TPZIntelGen<pzshape::TPZShapePoint>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElWithMem_01927e18;
  TPZVec<long>::TPZVec((TPZVec<long> *)&this->fIntPtIndices,0);
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore =
       (this->fIntPtIndices).super_TPZManVector<long,_128>.fExtAlloc;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNAlloc = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0193acb8;
  CopyIntPtIndicesFrom(this,copy);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh,
                                          const TPZCompElWithMem<TBASE> &copy,
                                          std::map<int64_t,int64_t> & gl2lcConMap,
                                          std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh,copy,gl2lcConMap,gl2lcElMap)
{
    CopyIntPtIndicesFrom(copy);
}